

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_limit_h(REF_DBL *metric,REF_GRID ref_grid,REF_DBL hmin,REF_DBL hmax)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  REF_NODE pRVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  undefined1 local_88 [16];
  double local_78;
  
  pRVar4 = ref_grid->node;
  if (0 < pRVar4->max) {
    dVar9 = 1.0 / (hmin * hmin);
    dVar8 = 1.0 / (hmax * hmax);
    lVar7 = 0;
    do {
      if (-1 < pRVar4->global[lVar7]) {
        uVar3 = ref_matrix_diag_m(metric,(REF_DBL *)local_88);
        if (uVar3 != 0) {
          pcVar6 = "eigen decomp";
          uVar5 = 0x83e;
LAB_001d0d83:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar5,"ref_metric_limit_h",(ulong)uVar3,pcVar6);
          return uVar3;
        }
        if ((0.0 < hmin) &&
           (auVar1._8_8_ = dVar9, auVar1._0_8_ = dVar9, local_88 = minpd(local_88,auVar1),
           dVar9 <= local_78)) {
          local_78 = dVar9;
        }
        if ((0.0 < hmax) &&
           (auVar2._8_8_ = dVar8, auVar2._0_8_ = dVar8, local_88 = maxpd(local_88,auVar2),
           local_78 <= dVar8)) {
          local_78 = dVar8;
        }
        uVar3 = ref_matrix_form_m((REF_DBL *)local_88,metric);
        if (uVar3 != 0) {
          pcVar6 = "reform m";
          uVar5 = 0x84b;
          goto LAB_001d0d83;
        }
        pRVar4 = ref_grid->node;
      }
      lVar7 = lVar7 + 1;
      metric = metric + 6;
    } while (lVar7 < pRVar4->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_h(REF_DBL *metric, REF_GRID ref_grid,
                                      REF_DBL hmin, REF_DBL hmax) {
  REF_DBL diag_system[12];
  REF_DBL eig;
  REF_INT node;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
    if (hmin > 0.0) {
      eig = 1.0 / (hmin * hmin);
      ref_matrix_eig(diag_system, 0) = MIN(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MIN(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MIN(ref_matrix_eig(diag_system, 2), eig);
    }
    if (hmax > 0.0) {
      eig = 1.0 / (hmax * hmax);
      ref_matrix_eig(diag_system, 0) = MAX(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MAX(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MAX(ref_matrix_eig(diag_system, 2), eig);
    }
    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
  }
  return REF_SUCCESS;
}